

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O0

void slang::ast::addProperty
               (Scope *scope,string_view name,VariableLifetime lifetime,StructBuilder *structBuilder
               )

{
  Compilation *args_3;
  undefined4 in_ECX;
  BumpAllocator *in_RSI;
  Scope *in_RDI;
  VariableLifetime *in_R8;
  ClassPropertySymbol *prop;
  Compilation *comp;
  Type *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffffe0;
  
  args_3 = Scope::getCompilation(in_RDI);
  uVar1 = 0;
  BumpAllocator::
  emplace<slang::ast::ClassPropertySymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation_const&,slang::ast::VariableLifetime&,slang::ast::Visibility>
            (in_RSI,(basic_string_view<char,_std::char_traits<char>_> *)in_RDI,
             (SourceLocation *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_R8,(Visibility *)args_3
            );
  ValueSymbol::setType
            ((ValueSymbol *)CONCAT44(uVar1,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8);
  Scope::addMember((Scope *)CONCAT44(uVar1,in_stack_ffffffffffffffc0),
                   &in_stack_ffffffffffffffb8->super_Symbol);
  return;
}

Assistant:

static void addProperty(Scope& scope, std::string_view name, VariableLifetime lifetime,
                        const StructBuilder& structBuilder) {
    auto& comp = scope.getCompilation();
    auto& prop = *comp.emplace<ClassPropertySymbol>(name, SourceLocation::NoLocation, lifetime,
                                                    Visibility::Public);
    prop.setType(structBuilder.type);
    scope.addMember(prop);
}